

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O3

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  Map_Man_t *p;
  char **ppNames;
  Abc_Time_t *pAVar7;
  Map_Time_t *pMVar8;
  Map_Node_t *pMVar9;
  Abc_Obj_t *pAVar10;
  Map_Node_t **ppMVar11;
  Vec_Ptr_t *pVVar12;
  long *plVar13;
  ulong uVar14;
  long *plVar15;
  char *__assertion;
  ulong uVar16;
  long lVar17;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                  ,0xe3,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  p = Map_ManCreate((pNtk->vPis->nSize + pNtk->nObjCounts[8]) - pNtk->nBarBufs,
                    (pNtk->nObjCounts[8] - pNtk->nBarBufs) + pNtk->vPos->nSize,fVerbose);
  if (p != (Map_Man_t *)0x0) {
    Map_ManSetAreaRecovery(p,fRecovery);
    ppNames = Abc_NtkCollectCioNames(pNtk,1);
    Map_ManSetOutputNames(p,ppNames);
    Map_ManSetDelayTarget(p,(float)DelayTarget);
    pAVar7 = Abc_NtkGetCiArrivalTimes(pNtk);
    pMVar8 = Abc_NtkMapCopyCiArrival(pNtk,pAVar7);
    Map_ManSetInputArrivals(p,pMVar8);
    pAVar7 = Abc_NtkGetCoRequiredTimes(pNtk);
    pMVar8 = Abc_NtkMapCopyCoRequired(pNtk,pAVar7);
    Map_ManSetOutputRequireds(p,pMVar8);
    Abc_NtkCleanCopy(pNtk);
    pMVar9 = Map_ManReadConst1(p);
    pAVar10 = Abc_AigConst1(pNtk);
    (pAVar10->field_6).pCopy = (Abc_Obj_t *)pMVar9;
    pVVar12 = pNtk->vCis;
    uVar14 = (ulong)(uint)pVVar12->nSize;
    if (0 < pVVar12->nSize) {
      uVar16 = 0;
      do {
        if (uVar16 == (uint)((int)uVar14 - pNtk->nBarBufs)) break;
        pvVar2 = pVVar12->pArray[uVar16];
        ppMVar11 = Map_ManReadInputs(p);
        pMVar9 = ppMVar11[uVar16];
        *(Map_Node_t **)((long)pvVar2 + 0x40) = pMVar9;
        if (pSwitching != (float *)0x0) {
          Map_NodeSetSwitching(pMVar9,pSwitching[*(int *)((long)pvVar2 + 0x10)]);
        }
        uVar16 = uVar16 + 1;
        pVVar12 = pNtk->vCis;
        uVar14 = (ulong)pVVar12->nSize;
      } while ((long)uVar16 < (long)uVar14);
    }
    pVVar12 = Abc_AigDfsMap(pNtk);
    if (0 < pVVar12->nSize) {
      lVar17 = 0;
      do {
        plVar3 = (long *)pVVar12->pArray[lVar17];
        uVar1 = *(uint *)((long)plVar3 + 0x14);
        if ((uVar1 & 0xf) == 7) {
          lVar5 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          pMVar9 = Map_NodeAnd(p,(Map_Node_t *)
                                 ((ulong)(uVar1 >> 10 & 1) ^
                                 *(ulong *)(*(long *)(lVar5 + (long)*(int *)plVar3[4] * 8) + 0x40)),
                               (Map_Node_t *)
                               ((ulong)(uVar1 >> 0xb & 1) ^
                               *(ulong *)(*(long *)(lVar5 + (long)((int *)plVar3[4])[1] * 8) + 0x40)
                               ));
          if (plVar3[8] != 0) {
            __assert_fail("pNode->pCopy == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                          ,0x10c,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
          }
          plVar3[8] = (long)pMVar9;
          if (pSwitching != (float *)0x0) {
            Map_NodeSetSwitching(pMVar9,pSwitching[(int)plVar3[2]]);
          }
          if (((ulong)plVar3 & 1) != 0) {
            __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0026c5ae:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (*(int *)*plVar3 != 3) {
            __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_0026c5ae;
          }
          if (((long *)plVar3[7] != (long *)0x0) &&
             (plVar4 = (long *)plVar3[7], plVar15 = plVar3, 0 < *(int *)((long)plVar3 + 0x2c))) {
            do {
              plVar13 = plVar4;
              Map_NodeSetNextE((Map_Node_t *)plVar15[8],(Map_Node_t *)plVar13[8]);
              Map_NodeSetRepr((Map_Node_t *)plVar13[8],(Map_Node_t *)plVar3[8]);
              plVar4 = (long *)plVar13[7];
              plVar15 = plVar13;
            } while ((long *)plVar13[7] != (long *)0x0);
          }
        }
        else {
          if ((uVar1 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                          ,0x107,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
          }
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
          pMVar9 = Map_NodeBuf(p,(Map_Node_t *)
                                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                                 *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                                     (long)*(int *)plVar4[4] * 8) + 0x40)));
          *(Map_Node_t **)
           (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8) + 0x40
           ) = pMVar9;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < pVVar12->nSize);
    }
    iVar6 = Map_ManReadBufNum(p);
    if (iVar6 != pNtk->nBarBufs) {
      __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                    ,0x119,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
    }
    if (pVVar12->pArray != (void **)0x0) {
      free(pVVar12->pArray);
    }
    free(pVVar12);
    pVVar12 = pNtk->vCos;
    uVar14 = (ulong)(uint)pVVar12->nSize;
    if (0 < pVVar12->nSize) {
      uVar16 = 0;
      do {
        if (uVar16 == (uint)((int)uVar14 - pNtk->nBarBufs)) {
          return p;
        }
        plVar3 = (long *)pVVar12->pArray[uVar16];
        uVar1 = *(uint *)((long)plVar3 + 0x14);
        uVar14 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                     (long)*(int *)plVar3[4] * 8) + 0x40);
        ppMVar11 = Map_ManReadOutputs(p);
        ppMVar11[uVar16] = (Map_Node_t *)(uVar1 >> 10 & 1 ^ uVar14);
        uVar16 = uVar16 + 1;
        pVVar12 = pNtk->vCos;
        uVar14 = (ulong)pVVar12->nSize;
      } while ((long)uVar16 < (long)uVar14);
    }
  }
  return p;
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );
    Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}